

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

void __thiscall Shell::buildSpectestModule(Shell *this)

{
  undefined8 uVar1;
  Builder BVar2;
  Const *pCVar3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var5;
  Name NVar6;
  undefined1 auVar7 [16];
  undefined1 local_e8 [8];
  Register registration;
  Result<wasm::Ok> registered;
  Result<wasm::Ok> added;
  Builder local_80;
  Builder builder;
  shared_ptr<wasm::Module> spectest;
  __single_object glob;
  
  builder.wasm = (Module *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::Module,std::allocator<wasm::Module>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spectest,&builder.wasm,
             (_Sp_alloc_shared_tag<std::allocator<wasm::Module>_>)
             &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BVar2 = builder;
  ((builder.wasm)->features).features = 0x3fffff;
  local_80.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(0);
  pCVar3 = wasm::Builder::makeConst<unsigned_int>(&local_80,0x29a);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x2;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = (size_t)pCVar3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  wasm::Module::addGlobal((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x50);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(1);
  pCVar3 = wasm::Builder::makeConst<unsigned_long>(&local_80,0x29a);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x3;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = (size_t)pCVar3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  wasm::Module::addGlobal((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x50);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(2);
  pCVar3 = wasm::Builder::makeConst<float>(&local_80,666.6);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x4;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = (size_t)pCVar3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  wasm::Module::addGlobal((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x50);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(3);
  pCVar3 = wasm::Builder::makeConst<double>(&local_80,666.6);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x5;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = (size_t)pCVar3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  wasm::Module::addGlobal((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x50);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(10,"global_i32",0);
  NVar6 = wasm::Name::fromInt(0);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(10,"global_i64",0);
  NVar6 = wasm::Name::fromInt(1);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(10,"global_f32",0);
  NVar6 = wasm::Name::fromInt(2);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(10,"global_f64",0);
  NVar6 = wasm::Name::fromInt(3);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 3;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(0);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0xffffffff;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x2;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 0x12;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 0x12;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x2;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0xa;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0x14;
  wasm::Module::addTable((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x58);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(5,"table",0);
  NVar6 = wasm::Name::fromInt(0);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 1;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(1);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0xffffffff;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x2;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 0x12;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 0x12;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x3;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0xa;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0x14;
  wasm::Module::addTable((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x58);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::IString::interned(7,"table64",0);
  NVar6 = wasm::Name::fromInt(1);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  *(IString *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = NVar6.super_IString.str;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(undefined4 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 1;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x30);
  }
  BVar2.wasm = builder.wasm;
  _Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)wasm::Name::fromInt(0);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [4]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [2]._M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count = (char *)0x0;
  ((string_view *)
  &(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
   _vptr__Sp_counted_base)->_M_len = 0;
  *(char **)&(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count = (char *)0x0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 0x10000;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 2;
  *spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5;
  *(char **)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [3]._M_use_count = (char *)0x1;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
   _vptr__Sp_counted_base)->_M_len = 2;
  *(undefined1 *)
   &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
  ((string_view *)
  &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
   _vptr__Sp_counted_base)->_M_len = 2;
  puVar4 = (undefined8 *)wasm::Module::addMemory((unique_ptr *)BVar2.wasm);
  if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,0x58);
  }
  BVar2.wasm = builder.wasm;
  auVar7 = wasm::IString::interned(6,"memory",0);
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar4;
  uVar1 = puVar4[1];
  registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = operator_new(0x30);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   (*(undefined1 (*) [16])
     (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) + 8) =
       spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined8 *)
   *(undefined1 (*) [16])
    (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
     super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = uVar1;
  *(undefined1 (*) [16])
   registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
   super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = auVar7;
  *(undefined4 *)
   *(undefined1 (*) [16])
    (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
     super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) = 2;
  (*(undefined1 (*) [16])
    (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
     super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20))[8] = 0;
  wasm::Module::addExport((unique_ptr *)BVar2.wasm);
  if (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ != 0) {
    operator_delete((void *)registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,0x30);
  }
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)builder.wasm;
  builder.wasm = (Module *)0x0;
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  addModule((Result<wasm::Ok> *)
            ((long)&registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,
            (WASTModule *)
            &spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
    auVar7 = wasm::IString::interned(8,"spectest",0);
    registration.name.super_IString.str._M_len = auVar7._8_8_;
    local_e8 = auVar7._0_8_;
    addRegistration((Result<wasm::Ok> *)&registration.name.super_IString.str._M_str,this,
                    (Register *)local_e8);
    if (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &registration.name.super_IString.str._M_str);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      if (spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      return;
    }
    wasm::handle_unreachable
              ("error registering spectest module",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,0x1f8);
  }
  wasm::handle_unreachable
            ("error building spectest module",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
             ,499);
}

Assistant:

void buildSpectestModule() {
    auto spectest = std::make_shared<Module>();
    spectest->features = FeatureSet::All;
    Builder builder(*spectest);

    spectest->addGlobal(builder.makeGlobal(Name::fromInt(0),
                                           Type::i32,
                                           builder.makeConst<uint32_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(1),
                                           Type::i64,
                                           builder.makeConst<uint64_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(2),
                                           Type::f32,
                                           builder.makeConst<float>(666.6f),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(3),
                                           Type::f64,
                                           builder.makeConst<double>(666.6),
                                           Builder::Immutable));
    spectest->addExport(
      builder.makeExport("global_i32", Name::fromInt(0), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_i64", Name::fromInt(1), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f32", Name::fromInt(2), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f64", Name::fromInt(3), ExternalKind::Global));

    spectest->addTable(builder.makeTable(
      Name::fromInt(0), Type(HeapType::func, Nullable), 10, 20));
    spectest->addExport(
      builder.makeExport("table", Name::fromInt(0), ExternalKind::Table));

    spectest->addTable(builder.makeTable(
      Name::fromInt(1), Type(HeapType::func, Nullable), 10, 20, Type::i64));
    spectest->addExport(
      builder.makeExport("table64", Name::fromInt(1), ExternalKind::Table));

    Memory* memory =
      spectest->addMemory(builder.makeMemory(Name::fromInt(0), 1, 2));
    spectest->addExport(
      builder.makeExport("memory", memory->name, ExternalKind::Memory));

    // print_* functions are handled separately, no need to define here.

    WASTModule mod = std::move(spectest);
    auto added = addModule(mod);
    if (added.getErr()) {
      WASM_UNREACHABLE("error building spectest module");
    }
    Register registration{"spectest"};
    auto registered = addRegistration(registration);
    if (registered.getErr()) {
      WASM_UNREACHABLE("error registering spectest module");
    }
  }